

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void cnn_convolve_no_maxpool_padding_valid_2x2_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float **in_RDI;
  CNN_LAYER_CONFIG *in_R8;
  float **in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000110;
  int in_stack_00000114;
  float **in_stack_00000118;
  CNN_LAYER_CONFIG *in_stack_00000120;
  int in_stack_0000012c;
  float **in_stack_00000130;
  int in_stack_000001d0;
  int in_stack_000001d4;
  float **in_stack_000001d8;
  CNN_LAYER_CONFIG *in_stack_000001e0;
  int in_stack_000001ec;
  float **in_stack_000001f0;
  int in_stack_ffffffffffffffb8;
  
  if ((in_ESI == 0x10) && (in_EDX == 0x10)) {
    cnn_convolve_no_maxpool_padding_valid_layer1_avx2
              (in_stack_000001f0,in_stack_000001ec,in_stack_000001e0,in_stack_000001d8,
               in_stack_000001d4,in_stack_000001d0,in_stack_00000020,in_stack_ffffffffffffffb8);
  }
  else if ((in_ESI == 8) && (in_EDX == 8)) {
    cnn_convolve_no_maxpool_padding_valid_layer2_avx2
              (in_stack_00000130,in_stack_0000012c,in_stack_00000120,in_stack_00000118,
               in_stack_00000114,in_stack_00000110,in_stack_00000020,in_stack_ffffffffffffffb8);
  }
  else {
    av1_cnn_convolve_no_maxpool_padding_valid_c
              (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020);
  }
  return;
}

Assistant:

static void cnn_convolve_no_maxpool_padding_valid_2x2_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    int start_idx, const int cstep, const int channel_step) {
  assert(layer_config->filter_width == 2 && layer_config->filter_height == 2);
  assert(layer_config->skip_width == 2 && layer_config->skip_height == 2);

  if (in_width == 16 && in_height == 16) {
    // This case of in_width and in_height equal to 16 corresponds to layer 1.
    // The output size of this layer is 8x8.
    cnn_convolve_no_maxpool_padding_valid_layer1_avx2(
        input, in_stride, layer_config, output, out_stride, start_idx, cstep,
        channel_step);
  } else if (in_width == 8 && in_height == 8) {
    // This case of in_width and in_height equal to 8 corresponds to layer 2.
    // The output size of this layer is 4x4.
    cnn_convolve_no_maxpool_padding_valid_layer2_avx2(
        input, in_stride, layer_config, output, out_stride, start_idx, cstep,
        channel_step);
  } else {
    // For layer equal to 3 and 4, the input is of size 4x4 and 2x2
    // respectively. Implementing SIMD for these cases might not be optimal,
    // which is why we call C path for layer >= 3.
    av1_cnn_convolve_no_maxpool_padding_valid_c(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  }
}